

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraph.cxx
# Opt level: O0

ExpandMacroResult
cmCMakePresetsGraphInternal::ExpandMacro
          (string *out,string *macroNamespace,string *macroName,MacroExpanderVector *macroExpanders,
          int version)

{
  bool bVar1;
  ExpandMacroResult EVar2;
  reference this;
  type pMVar3;
  ExpandMacroResult result;
  unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>
  *macroExpander;
  const_iterator __end1;
  const_iterator __begin1;
  MacroExpanderVector *__range1;
  int version_local;
  MacroExpanderVector *macroExpanders_local;
  string *macroName_local;
  string *macroNamespace_local;
  string *out_local;
  
  __end1 = std::
           vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>_>_>
           ::begin(macroExpanders);
  macroExpander =
       (unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>
        *)std::
          vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>_>_>
          ::end(macroExpanders);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>_*,_std::vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>_>_>_>
                                *)&macroExpander);
    if (!bVar1) {
      bVar1 = std::operator==(macroNamespace,"vendor");
      if (bVar1) {
        out_local._4_4_ = Ignore;
      }
      else {
        out_local._4_4_ = Error;
      }
      return out_local._4_4_;
    }
    this = __gnu_cxx::
           __normal_iterator<const_std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>_*,_std::vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>_>_>_>
           ::operator*(&__end1);
    pMVar3 = std::
             unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>
             ::operator*(this);
    EVar2 = (**pMVar3->_vptr_MacroExpander)
                      (pMVar3,macroNamespace,macroName,out,(ulong)(uint)version);
    if (EVar2 != Ignore) break;
    __gnu_cxx::
    __normal_iterator<const_std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>_*,_std::vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>_>_>_>
    ::operator++(&__end1);
  }
  return EVar2;
}

Assistant:

ExpandMacroResult cmCMakePresetsGraphInternal::ExpandMacro(
  std::string& out, const std::string& macroNamespace,
  const std::string& macroName, MacroExpanderVector const& macroExpanders,
  int version)
{
  for (auto const& macroExpander : macroExpanders) {
    auto result = (*macroExpander)(macroNamespace, macroName, out, version);
    if (result != ExpandMacroResult::Ignore) {
      return result;
    }
  }

  if (macroNamespace == "vendor") {
    return ExpandMacroResult::Ignore;
  }

  return ExpandMacroResult::Error;
}